

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

Vec_Str_t * Vec_StrRead(char **ppStr)

{
  int iVar1;
  int *piVar2;
  Vec_Str_t *pVVar3;
  
  piVar2 = (int *)*ppStr;
  pVVar3 = (Vec_Str_t *)malloc(0x10);
  pVVar3->nCap = 0;
  pVVar3->nSize = 0;
  pVVar3->pArray = (char *)0x0;
  iVar1 = *piVar2;
  pVVar3->nSize = iVar1;
  pVVar3->pArray = (char *)(piVar2 + 1);
  *ppStr = (char *)((long)piVar2 + (long)iVar1 + 4);
  return pVVar3;
}

Assistant:

Vec_Str_t * Vec_StrRead( char ** ppStr )
{
    Vec_Str_t * p;
    char * pStr = *ppStr;
    p = Vec_StrAlloc( 0 );
    p->nSize = *(int *)pStr;
    p->pArray = pStr + sizeof(int);
    *ppStr = pStr + sizeof(int) + p->nSize * sizeof(char);
    return p;
}